

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

char * curl_pushheader_bynum(curl_pushheaders *h,size_t num)

{
  HTTP *pHVar1;
  HTTP *stream;
  size_t num_local;
  curl_pushheaders *h_local;
  
  if (((h == (curl_pushheaders *)0x0) || (h->data == (Curl_easy *)0x0)) ||
     (h->data->magic != 0xc0dedbad)) {
    h_local = (curl_pushheaders *)0x0;
  }
  else {
    pHVar1 = (h->data->req).p.http;
    if (num < pHVar1->push_headers_used) {
      h_local = (curl_pushheaders *)pHVar1->push_headers[num];
    }
    else {
      h_local = (curl_pushheaders *)0x0;
    }
  }
  return (char *)h_local;
}

Assistant:

char *curl_pushheader_bynum(struct curl_pushheaders *h, size_t num)
{
  /* Verify that we got a good easy handle in the push header struct, mostly to
     detect rubbish input fast(er). */
  if(!h || !GOOD_EASY_HANDLE(h->data))
    return NULL;
  else {
    struct HTTP *stream = h->data->req.p.http;
    if(num < stream->push_headers_used)
      return stream->push_headers[num];
  }
  return NULL;
}